

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int iter_codes(lua_State *L)

{
  int iVar1;
  code *fn;
  
  iVar1 = lua_toboolean(L,2);
  luaL_checklstring(L,1,(size_t *)0x0);
  fn = iter_auxlax;
  if (iVar1 == 0) {
    fn = iter_auxstrict;
  }
  lua_pushcclosure(L,fn,0);
  lua_pushvalue(L,1);
  lua_pushinteger(L,0);
  return 3;
}

Assistant:

static int iter_codes (lua_State *L) {
  int lax = lua_toboolean(L, 2);
  luaL_checkstring(L, 1);
  lua_pushcfunction(L, lax ? iter_auxlax : iter_auxstrict);
  lua_pushvalue(L, 1);
  lua_pushinteger(L, 0);
  return 3;
}